

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_void> *
pybind11::detail::load_type<std::vector<NodePosition,std::allocator<NodePosition>>,void>
          (type_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_void> *conv,
          handle *handle)

{
  bool bVar1;
  cast_error *this;
  
  bVar1 = list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>::load
                    (&conv->
                      super_list_caster<std::vector<NodePosition,_std::allocator<NodePosition>_>,_NodePosition>
                     ,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  cast_error::runtime_error
            (this,"Unable to cast Python instance to C++ type (compile in debug mode for details)");
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}